

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResupplyOfferPdu.cpp
# Opt level: O0

bool __thiscall DIS::ResupplyOfferPdu::operator==(ResupplyOfferPdu *this,ResupplyOfferPdu *rhs)

{
  bool bVar1;
  size_type sVar2;
  const_reference this_00;
  const_reference rhs_00;
  ulong local_28;
  size_t idx;
  bool ivarsEqual;
  ResupplyOfferPdu *rhs_local;
  ResupplyOfferPdu *this_local;
  
  idx._7_1_ = LogisticsFamilyPdu::operator==
                        (&this->super_LogisticsFamilyPdu,&rhs->super_LogisticsFamilyPdu);
  bVar1 = EntityID::operator==(&this->_receivingEntityID,&rhs->_receivingEntityID);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  bVar1 = EntityID::operator==(&this->_supplyingEntityID,&rhs->_supplyingEntityID);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  if (this->_padding1 != rhs->_padding1) {
    idx._7_1_ = false;
  }
  if (this->_padding2 != rhs->_padding2) {
    idx._7_1_ = false;
  }
  local_28 = 0;
  while( true ) {
    sVar2 = std::vector<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>::size
                      (&this->_supplies);
    if (sVar2 <= local_28) break;
    this_00 = std::vector<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>::operator[]
                        (&this->_supplies,local_28);
    rhs_00 = std::vector<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>::operator[]
                       (&rhs->_supplies,local_28);
    bVar1 = SupplyQuantity::operator==(this_00,rhs_00);
    if (!bVar1) {
      idx._7_1_ = false;
    }
    local_28 = local_28 + 1;
  }
  return idx._7_1_;
}

Assistant:

bool ResupplyOfferPdu::operator ==(const ResupplyOfferPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = LogisticsFamilyPdu::operator==(rhs);

     if( ! (_receivingEntityID == rhs._receivingEntityID) ) ivarsEqual = false;
     if( ! (_supplyingEntityID == rhs._supplyingEntityID) ) ivarsEqual = false;
     if( ! (_padding1 == rhs._padding1) ) ivarsEqual = false;
     if( ! (_padding2 == rhs._padding2) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _supplies.size(); idx++)
     {
        if( ! ( _supplies[idx] == rhs._supplies[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }